

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# startup.cpp
# Opt level: O1

void init_scheme(void)

{
  __buckets_ptr pp_Var1;
  bool bVar2;
  time_t tVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ParseResult x;
  istringstream st;
  undefined1 local_239;
  SchemeEnvironment *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  shared_ptr<SchemeObject> local_228;
  undefined1 local_210 [24];
  string local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [24];
  _Head_base<0UL,_TailContext_*,_false> local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Any_data local_198;
  code *local_188;
  longlong local_178;
  longlong local_170 [6];
  ios_base local_140 [272];
  
  start_time = get_current_time();
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  current_input_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_SchemePort;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&current_input_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_SchemePort;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_1a8._M_allocated_capacity = 0;
  local_1a8._M_local_buf[8] = '\0';
  local_1b8._M_allocated_capacity = (size_type)&local_1b8;
  local_1b8._8_8_ = &local_1b8;
  std::__cxx11::
  list<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
  ::_M_move_assign(&global_context.locals,&local_1b8);
  global_context.toplevel = (bool)local_1a8._M_local_buf[8];
  std::__cxx11::
  _List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
  ::_M_clear((_List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
              *)&local_1b8);
  Context::new_frame(&global_context);
  global_context.toplevel = true;
  Registry<std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
  ::all();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._16_8_;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
              *)&local_1b8,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
              *)&p_Var4->_M_use_count);
      local_238 = (SchemeEnvironment *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SchemeSpecialForm,std::allocator<SchemeSpecialForm>,std::__cxx11::string_const&>
                (&_Stack_230,(SchemeSpecialForm **)&local_238,
                 (allocator<SchemeSpecialForm> *)&local_239,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8);
      local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_238->super_SchemeObject;
      local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_230._M_pi;
      local_238 = (SchemeEnvironment *)0x0;
      _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Context::set(&global_context,(string *)&local_1b8,&local_228);
      if (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (_Stack_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_230._M_pi);
      }
      if (local_188 != (code *)0x0) {
        (*local_188)(&local_198,&local_198,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_allocated_capacity != &local_1a8) {
        operator_delete((void *)local_1b8._M_allocated_capacity,local_1a8._M_allocated_capacity + 1)
        ;
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4->_vptr__Sp_counted_base;
    } while (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_210);
  Registry<std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
  ::all();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._16_8_;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
              *)&local_1b8,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>
              *)&p_Var4->_M_use_count);
      local_238 = (SchemeEnvironment *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SchemePrimitiveProcedure,std::allocator<SchemePrimitiveProcedure>,std::__cxx11::string_const&,long_long&,long_long&>
                (&_Stack_230,(SchemePrimitiveProcedure **)&local_238,
                 (allocator<SchemePrimitiveProcedure> *)&local_239,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8,
                 local_170,&local_178);
      local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_238->super_SchemeObject;
      local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_230._M_pi;
      local_238 = (SchemeEnvironment *)0x0;
      _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Context::set(&global_context,(string *)&local_1b8,&local_228);
      if (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (_Stack_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_230._M_pi);
      }
      if (local_188 != (code *)0x0) {
        (*local_188)(&local_198,&local_198,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_allocated_capacity != &local_1a8) {
        operator_delete((void *)local_1b8._M_allocated_capacity,local_1a8._M_allocated_capacity + 1)
        ;
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4->_vptr__Sp_counted_base;
    } while (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_210);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b8._M_local_buf);
  std::__cxx11::stringbuf::str((string *)local_1a8._M_local_buf);
  do {
    read_object((ParseResult *)local_210,(istream *)local_1b8._M_local_buf);
    if (local_210._0_4_ == END) {
      bVar2 = false;
    }
    else {
      if (local_210._0_4_ == ERROR) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error during initialization: ",0x1d);
        std::operator<<((ostream *)&std::cout,local_1f8);
        exit(1);
      }
      ASTNode::evaluate((ExecutionResult *)local_1d8,(ASTNode *)local_210._8_8_,&global_context);
      if ((_Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>)local_1c0._M_head_impl
          != (TailContext *)0x0) {
        std::default_delete<TailContext>::operator()
                  ((default_delete<TailContext> *)&local_1c0,local_1c0._M_head_impl);
      }
      local_1c0._M_head_impl = (TailContext *)0x0;
      bVar2 = true;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._16_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._0_8_ != &local_1e8) {
      operator_delete((void *)local_1f8._0_8_,local_1e8._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._16_8_);
    }
  } while (bVar2);
  pp_Var1 = (__buckets_ptr)(local_210 + 0x10);
  local_210._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"console-i/o-port","");
  local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (default_port.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  Context::set(&global_context,(string *)local_210,&local_228);
  if (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((__buckets_ptr)local_210._0_8_ != pp_Var1) {
    operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
  }
  local_210._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"user-initial-environment","")
  ;
  local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Context::set(&global_context,(string *)local_210,&local_228);
  if (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((__buckets_ptr)local_210._0_8_ != pp_Var1) {
    operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
  }
  Context::new_frame(&global_context);
  global_context.toplevel = true;
  local_210._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"user-initial-environment","")
  ;
  local_238 = (SchemeEnvironment *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SchemeEnvironment,std::allocator<SchemeEnvironment>,Context&>
            (&_Stack_230,&local_238,(allocator<SchemeEnvironment> *)&local_239,&global_context);
  local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_238->super_SchemeObject;
  local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_230._M_pi;
  local_238 = (SchemeEnvironment *)0x0;
  _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Context::assign(&global_context,(string *)local_210,&local_228);
  if (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_230._M_pi);
  }
  if ((__buckets_ptr)local_210._0_8_ != pp_Var1) {
    operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b8._M_local_buf);
  std::ios_base::~ios_base(local_140);
  return;
}

Assistant:

void init_scheme()
{
    start_time = get_current_time();
    srand(time(0));
    current_input_port = default_port;
    current_output_port = default_port;
    global_context = Context();
    global_context.new_frame();
    global_context.toplevel = true;
    for(auto p : SpecialFormRegistry::all())
    {
        global_context.set(p.first, std::make_shared<SchemeSpecialForm>(p.first));
    }
    for(auto p : FunctionRegistry::all())
    {
        global_context.set(p.first, std::make_shared<SchemePrimitiveProcedure>(p.first,
                                                                               std::get<0>(p.second),
                                                                               std::get<1>(p.second)));
    }
    std::istringstream st;
    st.str(startup);
    while(1)
    {
        auto x = read_object(st);
        if(x.result == parse_result_t::END)
            break;
        if(x.result == parse_result_t::ERROR)
        {
            std::cout << "Error during initialization: " << x.error;
            exit(1);
        }
        x.node->evaluate(global_context);
    }
    global_context.set("console-i/o-port", default_port);
    global_context.set("user-initial-environment", nullptr);
    global_context.new_frame();
    global_context.toplevel = true;
    global_context.assign("user-initial-environment", std::make_shared<SchemeEnvironment>(global_context));
}